

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  Status SVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  Status result;
  FileType type;
  Status del;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  FileLock *lock;
  string lockname;
  uint64_t number;
  Status local_f8;
  string *local_f0;
  FileType local_e4;
  Status local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  leveldb *local_c0;
  Status local_b8;
  Status local_b0;
  Status local_a8;
  undefined8 local_a0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint64_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pEVar1 = options->env;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = dbname;
  (*pEVar1->_vptr_Env[7])(&local_f8,pEVar1,dbname);
  if (local_f8.state_ == (char *)0x0) {
    LockFileName(&local_98,local_f0);
    (*pEVar1->_vptr_Env[0xd])(&local_78,pEVar1,&local_98,&local_a0);
    SVar2.state_ = local_f8.state_;
    local_f8.state_ = local_78._M_dataplus._M_p;
    local_78._M_dataplus._M_p = SVar2.state_;
    Status::~Status((Status *)&local_78);
    if (local_f8.state_ == (char *)0x0) {
      lVar4 = 0;
      local_c0 = this;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)local_d8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_d8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1)
      {
        bVar3 = ParseFileName((string *)
                              ((long)&((local_d8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar4),&local_58,&local_e4);
        if (bVar3 && local_e4 != kDBLockFile) {
          std::operator+(&local_50,local_f0,"/");
          std::operator+(&local_78,&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar4));
          (*pEVar1->_vptr_Env[8])(&local_e0,pEVar1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_50);
          if ((local_f8.state_ == (char *)0x0) && (local_e0.state_ != (char *)0x0)) {
            Status::operator=(&local_f8,&local_e0);
          }
          Status::~Status(&local_e0);
        }
        lVar4 = lVar4 + 0x20;
      }
      (*pEVar1->_vptr_Env[0xe])(&local_a8,pEVar1,local_a0);
      Status::~Status(&local_a8);
      (*pEVar1->_vptr_Env[8])(&local_b0,pEVar1,&local_98);
      Status::~Status(&local_b0);
      (*pEVar1->_vptr_Env[10])(&local_b8,pEVar1,local_f0);
      Status::~Status(&local_b8);
      this = local_c0;
    }
    *(char **)this = local_f8.state_;
    local_f8.state_ = (char *)0x0;
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    *(undefined8 *)this = 0;
  }
  Status::~Status(&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}